

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O1

int require_newline(IncludeState *state)

{
  Token TVar1;
  uint uVar2;
  
  if (state->pushedback == 0) {
    TVar1 = preprocessor_lexer(state);
  }
  else {
    state->pushedback = 0;
    TVar1 = state->tokenval;
  }
  if (state->pushedback == 0) {
    state->pushedback = 1;
    uVar2 = 1;
    if ((TVar1 != 10) && (TVar1 != TOKEN_INCOMPLETE_COMMENT)) {
      uVar2 = (uint)(TVar1 == TOKEN_EOI);
    }
    return uVar2;
  }
  __assert_fail("!state->pushedback",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                ,0x2d5,"void pushback(IncludeState *)");
}

Assistant:

static int require_newline(IncludeState *state)
{
    const Token token = lexer(state);
    pushback(state);  // rewind no matter what.
    return ( (token == TOKEN_INCOMPLETE_COMMENT) || // call it an eol.
             (token == ((Token) '\n')) || (token == TOKEN_EOI) );
}